

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O2

sockaddr_in6 *
mdns_record_parse_aaaa(void *buffer,size_t size,size_t offset,size_t length,sockaddr_in6 *addr)

{
  undefined8 uVar1;
  
  addr->sin6_family = 0;
  addr->sin6_port = 0;
  addr->sin6_flowinfo = 0;
  *(undefined8 *)&(addr->sin6_addr).__in6_u = 0;
  *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 4) = 0;
  *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 0xc) = 0;
  addr->sin6_family = 10;
  if (length == 0x10 && length + offset <= size) {
    uVar1 = ((undefined8 *)((long)buffer + offset))[1];
    *(undefined8 *)&(addr->sin6_addr).__in6_u = *(undefined8 *)((long)buffer + offset);
    *(undefined8 *)((long)&(addr->sin6_addr).__in6_u + 8) = uVar1;
  }
  return addr;
}

Assistant:

struct sockaddr_in6*
mdns_record_parse_aaaa(const void* buffer, size_t size, size_t offset, size_t length,
                       struct sockaddr_in6* addr) {
	memset(addr, 0, sizeof(struct sockaddr_in6));
	addr->sin6_family = AF_INET6;
#ifdef __APPLE__
	addr->sin6_len = sizeof(struct sockaddr_in6);
#endif
	if ((size >= offset + length) && (length == 16))
		addr->sin6_addr = *(const struct in6_addr*)((const char*)buffer + offset);
	return addr;
}